

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console_command_context.cpp
# Opt level: O0

bool __thiscall
jessibot::io::console_command_context::privateReply
          (console_command_context *this,formatted_message *in_message)

{
  wostream *this_00;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *in_string;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  undefined1 local_38 [8];
  u8string result;
  formatted_message *in_message_local;
  console_command_context *this_local;
  
  result.field_2._8_8_ = in_message;
  jessilib::io::process_message<jessilib::io::ansi::text_wrapper>((u8string *)local_38,in_message);
  jessilib::string_cast<wchar_t,std::__cxx11::u8string>(&local_58,(jessilib *)local_38,in_string);
  this_00 = std::operator<<((wostream *)&std::wcout,(wstring *)&local_58);
  std::wostream::operator<<(this_00,std::endl<wchar_t,std::char_traits<wchar_t>>);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  std::__cxx11::u8string::~u8string((u8string *)local_38);
  return true;
}

Assistant:

bool console_command_context::privateReply(const jessilib::io::formatted_message& in_message) {
	auto result = jessilib::io::process_message<jessilib::io::ansi::text_wrapper>(in_message);
	// TODO check locale before printing to see if console is using UTF-8; if so we can just chuck this straight to cout
	// instead of leveraging to wchar_t
	std::wcout << jessilib::string_cast<wchar_t>(result) << std::endl;
	return true;
}